

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O3

unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> __thiscall
amrex::MultiFab::OverlapMask(MultiFab *this,Periodicity *period)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  FabFactory<amrex::FArrayBox> *factory;
  FArrayBox *pFVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  int iVar13;
  FabArray<amrex::FArrayBox> *this_00;
  uint uVar14;
  Periodicity *in_RDX;
  pointer ppVar15;
  long lVar16;
  pointer pIVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  long lVar21;
  void *__s;
  int iVar22;
  bool bVar23;
  int iVar25;
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  int iVar27;
  __single_object *p;
  vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_> isects;
  Box r;
  MFIter mfi;
  undefined1 local_148 [16];
  pointer local_138;
  Box local_128;
  vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> local_108;
  BoxArray *local_f0;
  pointer local_e8;
  long local_e0;
  double *local_d8;
  Array4<double> local_d0;
  undefined1 local_90 [16];
  undefined1 auStack_80 [16];
  int iStack_70;
  int local_68;
  Vector<int,_std::allocator<int>_> *local_50;
  
  local_90._0_8_ =
       (__uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>)0x1;
  stack0xffffffffffffff78 = (undefined1  [16])0x0;
  stack0xffffffffffffff88 = (undefined1  [16])0x0;
  factory = *(FabFactory<amrex::FArrayBox> **)period[0x14].period.vect;
  this_00 = (FabArray<amrex::FArrayBox> *)operator_new(0x180);
  local_f0 = (BoxArray *)((period->period).vect + 2);
  local_d0.p = (double *)0x0;
  local_d0.jstride._0_4_ = 0;
  MultiFab((MultiFab *)this_00,local_f0,(DistributionMapping *)(period[9].period.vect + 1),1,
           (IntVect *)&local_d0,(MFInfo *)local_90,factory);
  (this->super_FabArray<amrex::FArrayBox>).super_FabArrayBase._vptr_FabArrayBase =
       (_func_int **)this_00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_80);
  Periodicity::shiftIntVect(&local_108,in_RDX);
  local_148 = (undefined1  [16])0x0;
  local_138 = (pointer)0x0;
  MFIter::MFIter((MFIter *)local_90,(FabArrayBase *)this_00,'\0');
  if (iStack_70 < local_68) {
    do {
      iVar13 = iStack_70;
      if (local_50 != (Vector<int,_std::allocator<int>_> *)0x0) {
        iVar13 = (local_50->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start[iStack_70];
      }
      pFVar7 = (this_00->m_fabs_v).
               super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl.
               super__Vector_impl_data._M_start[iVar13];
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(&local_d0,this_00,(MFIter *)local_90);
      iVar13 = *(int *)((long)&(pFVar7->super_BaseFab<double>).domain.smallend + 8);
      iVar18 = *(int *)((long)&(pFVar7->super_BaseFab<double>).domain.bigend + 8);
      if (iVar13 <= iVar18) {
        iVar1 = (pFVar7->super_BaseFab<double>).domain.bigend.vect[0];
        iVar2 = *(int *)((long)&(pFVar7->super_BaseFab<double>).domain.bigend + 4);
        iVar3 = *(int *)((long)&(pFVar7->super_BaseFab<double>).domain.smallend + 4);
        iVar4 = (pFVar7->super_BaseFab<double>).domain.smallend.vect[0];
        do {
          if (iVar3 <= iVar2) {
            lVar16 = CONCAT44(local_d0.jstride._4_4_,(undefined4)local_d0.jstride) * 8;
            __s = (void *)((long)local_d0.p +
                          ((long)iVar3 - (long)local_d0.begin.y) * lVar16 +
                          (iVar13 - local_d0.begin.z) * local_d0.kstride * 8 +
                          (long)local_d0.begin.x * -8 + (long)iVar4 * 8);
            iVar22 = (iVar2 - iVar3) + 1;
            do {
              if (iVar4 <= iVar1) {
                memset(__s,0,(ulong)(uint)(iVar1 - iVar4) * 8 + 8);
              }
              __s = (void *)((long)__s + lVar16);
              iVar22 = iVar22 + -1;
            } while (iVar22 != 0);
          }
          bVar23 = iVar13 != iVar18;
          iVar13 = iVar13 + 1;
        } while (bVar23);
      }
      local_e8 = local_108.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if (local_108.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_108.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pIVar17 = local_108.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        do {
          uVar8 = *(undefined8 *)(pFVar7->super_BaseFab<double>).domain.smallend.vect;
          uVar9 = *(undefined8 *)((long)&(pFVar7->super_BaseFab<double>).domain.smallend + 8);
          uVar10 = *(undefined8 *)((long)&(pFVar7->super_BaseFab<double>).domain.bigend + 8);
          local_128.bigend.vect[1] =
               (int)((ulong)*(undefined8 *)(pFVar7->super_BaseFab<double>).domain.bigend.vect >>
                    0x20);
          local_128.smallend.vect[2] = (int)uVar9;
          local_128.bigend.vect[0] = (int)((ulong)uVar9 >> 0x20);
          local_128.smallend.vect[0] = (int)uVar8 + (int)*(undefined8 *)pIVar17->vect;
          local_128.smallend.vect[1] =
               (int)((ulong)uVar8 >> 0x20) + (int)((ulong)*(undefined8 *)pIVar17->vect >> 0x20);
          local_128.smallend.vect[2] = local_128.smallend.vect[2] + pIVar17->vect[2];
          local_128.bigend.vect[0] = local_128.bigend.vect[0] + pIVar17->vect[0];
          local_128.bigend.vect[1] = local_128.bigend.vect[1] + pIVar17->vect[1];
          local_128.bigend.vect[2] = (int)uVar10;
          local_128.btype.itype = (uint)((ulong)uVar10 >> 0x20);
          local_128.bigend.vect[2] = local_128.bigend.vect[2] + pIVar17->vect[2];
          BoxArray::intersections
                    (local_f0,&local_128,
                     (vector<std::pair<int,_amrex::Box>,_std::allocator<std::pair<int,_amrex::Box>_>_>
                      *)local_148);
          auVar12 = _DAT_0065b9b0;
          auVar11 = _DAT_0065b9a0;
          if (local_148._0_8_ != local_148._8_8_) {
            iVar13 = pIVar17->vect[2];
            local_d8 = local_d0.p + -(long)local_d0.begin.x;
            lVar16 = CONCAT44(local_d0.jstride._4_4_,(undefined4)local_d0.jstride) * 8;
            local_e0 = -(long)local_d0.begin.y;
            ppVar15 = (pointer)local_148._0_8_;
            do {
              iVar18 = (ppVar15->second).smallend.vect[2];
              iVar1 = (ppVar15->second).bigend.vect[2];
              if (iVar18 <= iVar1) {
                iVar2 = (ppVar15->second).bigend.vect[0];
                iVar3 = (ppVar15->second).bigend.vect[1];
                iVar4 = pIVar17->vect[1];
                iVar22 = pIVar17->vect[0];
                iVar5 = (ppVar15->second).smallend.vect[1];
                iVar6 = (ppVar15->second).smallend.vect[0];
                uVar14 = iVar2 - iVar6;
                auVar24._4_4_ = 0;
                auVar24._0_4_ = uVar14;
                auVar24._8_4_ = uVar14;
                auVar24._12_4_ = 0;
                auVar24 = auVar24 ^ auVar12;
                iVar18 = iVar18 - iVar13;
                do {
                  if (iVar5 <= iVar3) {
                    lVar21 = (long)local_d8 +
                             ((long)iVar18 - (long)local_d0.begin.z) * local_d0.kstride * 8 +
                             ((iVar5 + local_e0) - (long)iVar4) * lVar16 + (long)iVar6 * 8 +
                             (long)iVar22 * -8;
                    iVar19 = iVar5 - iVar4;
                    do {
                      if (iVar6 <= iVar2) {
                        uVar20 = 0;
                        do {
                          auVar26._8_4_ = (int)uVar20;
                          auVar26._0_8_ = uVar20;
                          auVar26._12_4_ = (int)(uVar20 >> 0x20);
                          auVar26 = (auVar26 | auVar11) ^ auVar12;
                          bVar23 = auVar24._0_4_ < auVar26._0_4_;
                          iVar25 = auVar24._4_4_;
                          iVar27 = auVar26._4_4_;
                          if ((bool)(~(iVar25 < iVar27 || iVar27 == iVar25 && bVar23) & 1)) {
                            *(double *)(lVar21 + uVar20 * 8) =
                                 *(double *)(lVar21 + uVar20 * 8) + 1.0;
                          }
                          if (iVar25 >= iVar27 && (iVar27 != iVar25 || !bVar23)) {
                            *(double *)(lVar21 + 8 + uVar20 * 8) =
                                 *(double *)(lVar21 + 8 + uVar20 * 8) + 1.0;
                          }
                          uVar20 = uVar20 + 2;
                        } while (((ulong)uVar14 + 2 & 0xfffffffffffffffe) != uVar20);
                      }
                      iVar19 = iVar19 + 1;
                      lVar21 = lVar21 + lVar16;
                    } while ((iVar3 - iVar4) + 1 != iVar19);
                  }
                  bVar23 = iVar18 != iVar1 - iVar13;
                  iVar18 = iVar18 + 1;
                } while (bVar23);
              }
              ppVar15 = ppVar15 + 1;
            } while (ppVar15 != (pointer)local_148._8_8_);
          }
          pIVar17 = pIVar17 + 1;
        } while (pIVar17 != local_e8);
      }
      MFIter::operator++((MFIter *)local_90);
    } while (iStack_70 < local_68);
  }
  MFIter::~MFIter((MFIter *)local_90);
  if ((pointer)local_148._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._0_8_,(long)local_138 - local_148._0_8_);
  }
  if (local_108.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_108.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_108.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)
         (__uniq_ptr_data<amrex::MultiFab,_std::default_delete<amrex::MultiFab>,_true,_true>)this;
}

Assistant:

std::unique_ptr<MultiFab>
MultiFab::OverlapMask (const Periodicity& period) const
{
    BL_PROFILE("MultiFab::OverlapMask()");

    const BoxArray& ba = boxArray();
    const DistributionMapping& dm = DistributionMap();

    auto p = std::make_unique<MultiFab>(ba,dm,1,0, MFInfo(), Factory());

    const std::vector<IntVect>& pshifts = period.shiftIntVect();

    Vector<Array4BoxTag<Real> > tags;

    bool run_on_gpu = Gpu::inLaunchRegion();
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!run_on_gpu)
#endif
    {
        std::vector< std::pair<int,Box> > isects;

        for (MFIter mfi(*p); mfi.isValid(); ++mfi)
        {
            const Box& bx = (*p)[mfi].box();
            Array4<Real> const& arr = p->array(mfi);

            AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
            {
                arr(i,j,k) = Real(0.0);
            });

            for (const auto& iv : pshifts)
            {
                ba.intersections(bx+iv, isects);
                for (const auto& is : isects)
                {
                    Box const& b = is.second-iv;
                    if (run_on_gpu) {
                        tags.push_back({arr,b});
                    } else {
                        amrex::LoopConcurrentOnCpu(b, [=] (int i, int j, int k) noexcept
                        {
                            arr(i,j,k) += Real(1.0);
                        });
                    }
                }
            }
        }
    }

#ifdef AMREX_USE_GPU
    amrex::ParallelFor(tags, 1,
    [=] AMREX_GPU_DEVICE (int i, int j, int k, int n, Array4BoxTag<Real> const& tag) noexcept
    {
        Real* p = tag.dfab.ptr(i,j,k,n);
        Gpu::Atomic::AddNoRet(p, Real(1.0));
    });
#endif

    return p;
}